

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

uint nk_adler32(uint adler32,uchar *buffer,uint buflen)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong local_48;
  unsigned_long i;
  unsigned_long blocklen;
  unsigned_long s2;
  unsigned_long s1;
  unsigned_long ADLER_MOD;
  byte *pbStack_18;
  uint buflen_local;
  uchar *buffer_local;
  uint adler32_local;
  
  s2 = (unsigned_long)(adler32 & 0xffff);
  blocklen = (unsigned_long)(adler32 >> 0x10);
  i = (ulong)buflen % 0x15b0;
  pbStack_18 = buffer;
  for (ADLER_MOD._4_4_ = buflen; ADLER_MOD._4_4_ != 0; ADLER_MOD._4_4_ = ADLER_MOD._4_4_ - iVar8) {
    for (local_48 = 0; local_48 + 7 < i; local_48 = local_48 + 8) {
      lVar1 = *pbStack_18 + s2;
      lVar2 = (ulong)pbStack_18[1] + lVar1;
      lVar3 = (ulong)pbStack_18[2] + lVar2;
      lVar4 = (ulong)pbStack_18[3] + lVar3;
      lVar5 = (ulong)pbStack_18[4] + lVar4;
      lVar6 = (ulong)pbStack_18[5] + lVar5;
      lVar7 = (ulong)pbStack_18[6] + lVar6;
      s2 = (ulong)pbStack_18[7] + lVar7;
      blocklen = s2 + lVar7 + lVar6 + lVar5 + lVar4 + lVar3 + lVar2 + lVar1 + blocklen;
      pbStack_18 = pbStack_18 + 8;
    }
    for (; local_48 < i; local_48 = local_48 + 1) {
      s2 = *pbStack_18 + s2;
      blocklen = s2 + blocklen;
      pbStack_18 = pbStack_18 + 1;
    }
    s2 = s2 % 0xfff1;
    blocklen = blocklen % 0xfff1;
    iVar8 = (int)i;
    i = 0x15b0;
  }
  return (int)(blocklen << 0x10) + (int)s2;
}

Assistant:

NK_INTERN unsigned int
nk_adler32(unsigned int adler32, unsigned char *buffer, unsigned int buflen)
{
    const unsigned long ADLER_MOD = 65521;
    unsigned long s1 = adler32 & 0xffff, s2 = adler32 >> 16;
    unsigned long blocklen, i;

    blocklen = buflen % 5552;
    while (buflen) {
        for (i=0; i + 7 < blocklen; i += 8) {
            s1 += buffer[0]; s2 += s1;
            s1 += buffer[1]; s2 += s1;
            s1 += buffer[2]; s2 += s1;
            s1 += buffer[3]; s2 += s1;
            s1 += buffer[4]; s2 += s1;
            s1 += buffer[5]; s2 += s1;
            s1 += buffer[6]; s2 += s1;
            s1 += buffer[7]; s2 += s1;
            buffer += 8;
        }
        for (; i < blocklen; ++i) {
            s1 += *buffer++; s2 += s1;
        }

        s1 %= ADLER_MOD; s2 %= ADLER_MOD;
        buflen -= (unsigned int)blocklen;
        blocklen = 5552;
    }
    return (unsigned int)(s2 << 16) + (unsigned int)s1;
}